

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfMemory.c
# Opt level: O2

void * sbfMemory_malloc(size_t size)

{
  void *pvVar1;
  
  if (size == 0) {
    sbfFatal_die("zero size");
  }
  pvVar1 = malloc(size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  sbfFatal_die("out of memory");
}

Assistant:

void*
sbfMemory_malloc (size_t size)
{
    void* ptr;

    if (size == 0)
        SBF_FATAL ("zero size");

    ptr = malloc (size);
    if (ptr == NULL)
        SBF_FATAL ("out of memory");
    return ptr;
}